

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O3

void __thiscall xray_re::xr_scene_lights::save(xr_scene_lights *this,xr_writer *w)

{
  pointer pxVar1;
  pointer value;
  undefined1 local_24 [4];
  
  xr_scene_objects::save(&this->super_xr_scene_objects,w);
  xr_writer::w_raw_chunk(w,0x1001,local_24,2,false);
  xr_writer::w_raw_chunk(w,0x1004,&this->m_flags,4,false);
  xr_writer::open_chunk(w,0x1006);
  (*w->_vptr_xr_writer[2])(w,local_24,1);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1003);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1002);
  value = (this->m_controls).
          super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>._M_impl.
          super__Vector_impl_data._M_start;
  pxVar1 = (this->m_controls).
           super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (value != pxVar1) {
    do {
      xr_writer::w_sz(w,&value->name);
      (*w->_vptr_xr_writer[2])(w,local_24,4);
      value = value + 1;
    } while (value != pxVar1);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_scene_lights::save(xr_writer& w) const
{
	xr_scene_objects::save(w);
	w.w_chunk<uint16_t>(TOOLS_CHUNK_VERSION, 0);
	w.w_chunk<uint32_t>(LIGHTS_CHUNK_COMMON_FLAGS, m_flags);

	w.open_chunk(LIGHTS_CHUNK_COMMON_SUN);
	w.w_u8(0);
	w.w_fvector2(m_sun);
	w.close_chunk();

	w.open_chunk(LIGHTS_CHUNK_COMMON_COUNT);
	w.w_size_u32(m_controls.size());
	w.close_chunk();

	w.open_chunk(LIGHTS_CHUNK_COMMON_CONTROLS);
	w.w_seq(m_controls, write_token());
	w.close_chunk();
}